

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauTree.c
# Opt level: O1

int Dss_ManOperation(Dss_Man_t *p,int Type,int *pLits,int nLits,uchar *pPerm,word *pTruth)

{
  ulong *puVar1;
  uint uVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  byte bVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  Dss_Obj_t *pDVar11;
  uint uVar12;
  uint uVar13;
  Dss_Obj_t *pDVar14;
  Dss_Obj_t *pDVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  Dss_Obj_t *pChildren [12];
  int pBegEnd [12];
  Dss_Obj_t *local_c8 [12];
  uint local_68 [14];
  
  if (pPerm != (uchar *)0x0 && Type != 3) {
    __assert_fail("Type == DAU_DSD_AND || pPerm == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                  ,0x50d,
                  "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
  }
  if (pPerm != (uchar *)0x0 && Type == 3) {
    iVar16 = 0;
    uVar17 = 0;
    iVar8 = 0;
    if (0 < nLits) {
      pVVar4 = p->vObjs;
      uVar10 = 0;
      iVar8 = 0;
      uVar17 = 0;
      do {
        uVar12 = pLits[uVar10];
        if ((int)uVar12 < 0) goto LAB_004c7e79;
        if (pVVar4->nSize <= (int)(uVar12 >> 1)) goto LAB_004c7e5a;
        ppvVar5 = pVVar4->pArray;
        pvVar6 = ppvVar5[uVar12 >> 1];
        pDVar11 = (Dss_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)pvVar6);
        iVar9 = (int)uVar17;
        if ((((ulong)pDVar11 & 1) == 0) && ((*(uint *)&pDVar11->field_0x4 & 7) == 3)) {
          if (0x7ffffff < *(uint *)&pDVar11->field_0x4) {
            lVar18 = (long)iVar9;
            uVar17 = 0;
            do {
              uVar12 = (&pDVar11[1].Id)[uVar17];
              if ((int)uVar12 < 0) goto LAB_004c7e79;
              if (pVVar4->nSize <= (int)(uVar12 >> 1)) goto LAB_004c7e5a;
              pvVar6 = ppvVar5[uVar12 >> 1];
              if (pvVar6 == (void *)(ulong)(uVar12 & 1)) break;
              pDVar15 = (Dss_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)pvVar6);
              bVar7 = (*(uint *)&((Dss_Obj_t *)((ulong)pvVar6 & 0xfffffffffffffffe))->field_0x4 & 7)
                      == 2 & (byte)pDVar15;
              pDVar14 = (Dss_Obj_t *)((ulong)pvVar6 & 0xfffffffffffffffe);
              if (bVar7 == 0) {
                pDVar14 = pDVar15;
              }
              local_68[lVar18 + uVar17] =
                   (*(uint *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4) >> 3 & 0xff) + iVar8 |
                   iVar8 << 0x10 | (uint)bVar7 << 8;
              iVar8 = iVar8 + (*(uint *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4) >> 3 & 0xff);
              local_c8[lVar18 + uVar17] = pDVar14;
              uVar17 = uVar17 + 1;
            } while (uVar17 < *(uint *)&pDVar11->field_0x4 >> 0x1b);
            uVar17 = lVar18 + uVar17;
          }
        }
        else {
          pDVar14 = (Dss_Obj_t *)((ulong)pvVar6 & 0xfffffffffffffffe);
          bVar7 = (*(uint *)&pDVar14->field_0x4 & 7) == 2 & (byte)pDVar11;
          if (bVar7 == 0) {
            pDVar14 = pDVar11;
          }
          local_68[iVar9] =
               (*(uint *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4) >> 3 & 0xff) + iVar8 |
               iVar8 << 0x10 | (uint)bVar7 << 8;
          iVar8 = iVar8 + (*(uint *)(((ulong)pDVar14 & 0xfffffffffffffffe) + 4) >> 3 & 0xff);
          uVar17 = (ulong)(iVar9 + 1);
          local_c8[iVar9] = pDVar14;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)nLits);
    }
    Dss_ObjSort(p->vObjs,local_c8,(int)uVar17,(int *)local_68);
    if (0 < (int)uVar17) {
      uVar10 = 0;
      iVar16 = 0;
      do {
        uVar12 = local_68[uVar10];
        iVar9 = (int)uVar12 >> 0x10;
        if (iVar9 < (int)(uVar12 & 0xff)) {
          bVar7 = (byte)(uVar12 >> 8) & 1 | (char)(uVar12 >> 0x10) * '\x02';
          lVar18 = 0;
          do {
            if (iVar9 < 0) goto LAB_004c7e3b;
            pPerm[lVar18 + iVar16] = bVar7;
            lVar18 = lVar18 + 1;
            bVar7 = bVar7 + 2;
          } while ((uVar12 & 0xff) - iVar9 != (int)lVar18);
          iVar16 = iVar16 + (int)lVar18;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uVar17 & 0xffffffff));
    }
    if (iVar16 != iVar8) {
      __assert_fail("j == nSSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                    ,0x52e,
                    "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)");
    }
    uVar12 = 0;
    goto LAB_004c7dcb;
  }
  if (Type == 3) {
    uVar17 = 0;
    uVar12 = 0;
    if (0 < nLits) {
      pVVar4 = p->vObjs;
      uVar10 = 0;
      uVar17 = 0;
      do {
        uVar12 = pLits[uVar10];
        if ((int)uVar12 < 0) {
LAB_004c7e79:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf2,"int Abc_Lit2Var(int)");
        }
        iVar8 = pVVar4->nSize;
        if (iVar8 <= (int)(uVar12 >> 1)) {
LAB_004c7e5a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        ppvVar5 = pVVar4->pArray;
        pDVar11 = (Dss_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)ppvVar5[uVar12 >> 1]);
        iVar16 = (int)uVar17;
        if ((((ulong)pDVar11 & 1) == 0) &&
           (uVar12 = *(uint *)&pDVar11->field_0x4, (uVar12 & 7) == 3)) {
          if (0x7ffffff < uVar12) {
            uVar12 = uVar12 >> 0x1b;
            uVar17 = 0;
            do {
              uVar2 = (&pDVar11[1].Id)[uVar17];
              if ((int)uVar2 < 0) goto LAB_004c7e79;
              if (iVar8 <= (int)(uVar2 >> 1)) goto LAB_004c7e5a;
              pvVar6 = ppvVar5[uVar2 >> 1];
              if (pvVar6 == (void *)(ulong)(uVar2 & 1)) {
                uVar12 = (uint)uVar17;
                break;
              }
              local_c8[(long)iVar16 + uVar17] = (Dss_Obj_t *)((ulong)pvVar6 ^ (ulong)(uVar2 & 1));
              uVar17 = uVar17 + 1;
            } while (uVar12 != uVar17);
            uVar17 = (ulong)(uVar12 + iVar16);
          }
        }
        else {
          uVar17 = (ulong)(iVar16 + 1);
          local_c8[iVar16] = pDVar11;
        }
        uVar10 = uVar10 + 1;
        uVar12 = 0;
      } while (uVar10 != (uint)nLits);
    }
  }
  else {
    if (Type != 4) {
      if (Type == 5) {
        uVar12 = *pLits;
        if (-1 < (int)uVar12) {
          if ((uVar12 & 1) != 0) {
            *pLits = uVar12 & 0x7ffffffe;
            puVar1 = (ulong *)(pLits + 1);
            *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
          }
          uVar2 = pLits[1];
          if (-1 < (int)uVar2) {
            uVar17 = 0;
            uVar12 = 0;
            if ((uVar2 & 1) != 0) {
              pLits[1] = uVar2 & 0x7ffffffe;
              if (pLits[2] < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf4,"int Abc_LitNot(int)");
              }
              pLits[2] = pLits[2] ^ 1;
              uVar12 = 1;
            }
            if (0 < nLits) {
              pVVar4 = p->vObjs;
              uVar17 = 0;
              do {
                uVar2 = pLits[uVar17];
                if ((int)uVar2 < 0) goto LAB_004c7e79;
                if (pVVar4->nSize <= (int)(uVar2 >> 1)) goto LAB_004c7e5a;
                local_c8[uVar17] =
                     (Dss_Obj_t *)((ulong)(uVar2 & 1) ^ (ulong)pVVar4->pArray[uVar2 >> 1]);
                uVar17 = uVar17 + 1;
              } while ((uint)nLits != uVar17);
            }
            goto LAB_004c7dcb;
          }
        }
LAB_004c7eb7:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                      ,0xf3,"int Abc_LitIsCompl(int)");
      }
      if (Type != 6) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                      ,0x563,
                      "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)")
        ;
      }
      if (nLits < 1) {
        uVar17 = 0;
      }
      else {
        pVVar4 = p->vObjs;
        uVar17 = 0;
        do {
          uVar12 = pLits[uVar17];
          if ((int)uVar12 < 0) goto LAB_004c7e79;
          if (pVVar4->nSize <= (int)(uVar12 >> 1)) goto LAB_004c7e5a;
          local_c8[uVar17] = (Dss_Obj_t *)((ulong)(uVar12 & 1) ^ (ulong)pVVar4->pArray[uVar12 >> 1])
          ;
          uVar17 = uVar17 + 1;
        } while ((uint)nLits != uVar17);
      }
      uVar12 = 0;
      goto LAB_004c7dcb;
    }
    if (nLits < 1) {
      uVar17 = 0;
      uVar12 = 0;
    }
    else {
      uVar10 = 0;
      uVar12 = 0;
      uVar17 = 0;
      do {
        uVar2 = pLits[uVar10];
        if ((int)uVar2 < 0) goto LAB_004c7eb7;
        iVar8 = p->vObjs->nSize;
        if (iVar8 <= (int)(uVar2 >> 1)) goto LAB_004c7e5a;
        ppvVar5 = p->vObjs->pArray;
        pDVar11 = (Dss_Obj_t *)ppvVar5[uVar2 >> 1];
        uVar13 = *(uint *)&pDVar11->field_0x4;
        iVar16 = (int)uVar17;
        if ((uVar13 & 7) == 4) {
          if (0x7ffffff < uVar13) {
            uVar13 = uVar13 >> 0x1b;
            uVar17 = 0;
            do {
              uVar3 = (&pDVar11[1].Id)[uVar17];
              if ((int)uVar3 < 0) goto LAB_004c7e79;
              if (iVar8 <= (int)(uVar3 >> 1)) goto LAB_004c7e5a;
              pvVar6 = ppvVar5[uVar3 >> 1];
              if (pvVar6 == (void *)(ulong)(uVar3 & 1)) {
                uVar13 = (uint)uVar17;
                break;
              }
              pDVar14 = (Dss_Obj_t *)((ulong)pvVar6 ^ (ulong)(uVar3 & 1));
              if (((ulong)pDVar14 & 1) != 0) {
                __assert_fail("!Dss_IsComplement(pChild)",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauTree.c"
                              ,0x548,
                              "int Dss_ManOperation(Dss_Man_t *, int, int *, int, unsigned char *, word *)"
                             );
              }
              local_c8[(long)iVar16 + uVar17] = pDVar14;
              uVar17 = uVar17 + 1;
            } while (uVar13 != uVar17);
            uVar17 = (ulong)(uVar13 + iVar16);
          }
        }
        else {
          uVar17 = (ulong)(iVar16 + 1);
          local_c8[iVar16] = pDVar11;
        }
        uVar12 = uVar12 ^ uVar2 & 1;
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)nLits);
    }
  }
  Dss_ObjSort(p->vObjs,local_c8,(int)uVar17,(int *)0x0);
LAB_004c7dcb:
  p->vLeaves->nSize = 0;
  if (0 < (int)uVar17) {
    uVar10 = 0;
    do {
      iVar8 = *(int *)((ulong)local_c8[uVar10] & 0xfffffffffffffffe);
      if (iVar8 < 0) goto LAB_004c7e3b;
      Vec_IntPush(p->vLeaves,((uint)local_c8[uVar10] & 1) + iVar8 * 2);
      uVar10 = uVar10 + 1;
    } while ((uVar17 & 0xffffffff) != uVar10);
  }
  pDVar11 = Dss_ObjFindOrAdd(p,Type,p->vLeaves,pTruth);
  if (-1 < (int)pDVar11->Id) {
    return uVar12 + pDVar11->Id * 2;
  }
LAB_004c7e3b:
  __assert_fail("Var >= 0 && !(c >> 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                ,0xf1,"int Abc_Var2Lit(int, int)");
}

Assistant:

int Dss_ManOperation( Dss_Man_t * p, int Type, int * pLits, int nLits, unsigned char * pPerm, word * pTruth )
{
    Dss_Obj_t * pChildren[DAU_MAX_VAR];
    Dss_Obj_t * pObj, * pChild;
    int i, k, nChildren = 0, fCompl = 0, fComplFan;

    assert( Type == DAU_DSD_AND || pPerm == NULL );
    if ( Type == DAU_DSD_AND && pPerm != NULL )
    {
        int pBegEnd[DAU_MAX_VAR];
        int j, nSSize = 0;
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
            {
                fComplFan = (Dss_Regular(pObj)->Type == DAU_DSD_VAR && Dss_IsComplement(pObj));
                if ( fComplFan )
                    pObj = Dss_Regular(pObj);
                pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pObj)->nSupp);
                nSSize += Dss_Regular(pObj)->nSupp;
                pChildren[nChildren++] = pObj;
            }
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    fComplFan = (Dss_Regular(pChild)->Type == DAU_DSD_VAR && Dss_IsComplement(pChild));
                    if ( fComplFan )
                        pChild = Dss_Regular(pChild);
                    pBegEnd[nChildren] = (nSSize << 16) | (fComplFan << 8) | (nSSize + Dss_Regular(pChild)->nSupp);
                    nSSize += Dss_Regular(pChild)->nSupp;
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, pBegEnd );
        // create permutation
        for ( j = i = 0; i < nChildren; i++ )
            for ( k = (pBegEnd[i] >> 16); k < (pBegEnd[i] & 0xFF); k++ )
                pPerm[j++] = (unsigned char)Abc_Var2Lit( k, (pBegEnd[i] >> 8) & 1 );
        assert( j == nSSize );
    }
    else if ( Type == DAU_DSD_AND )
    {
        for ( k = 0; k < nLits; k++ )
        {
            pObj = Dss_Lit2Obj(p->vObjs, pLits[k]);
            if ( Dss_IsComplement(pObj) || pObj->Type != DAU_DSD_AND )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                    pChildren[nChildren++] = pChild;
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_XOR )
    {
        for ( k = 0; k < nLits; k++ )
        {
            fCompl ^= Abc_LitIsCompl(pLits[k]);
            pObj = Dss_Lit2Obj(p->vObjs, Abc_LitRegular(pLits[k]));
            if ( pObj->Type != DAU_DSD_XOR )
                pChildren[nChildren++] = pObj;
            else
                Dss_ObjForEachChild( p->vObjs, pObj, pChild, i )
                {
                    assert( !Dss_IsComplement(pChild) );
                    pChildren[nChildren++] = pChild;
                }
        }
        Dss_ObjSort( p->vObjs, pChildren, nChildren, NULL );
    }
    else if ( Type == DAU_DSD_MUX )
    {
        if ( Abc_LitIsCompl(pLits[0]) )
        {
            pLits[0] = Abc_LitNot(pLits[0]);
            ABC_SWAP( int, pLits[1], pLits[2] );
        }
        if ( Abc_LitIsCompl(pLits[1]) )
        {
            pLits[1] = Abc_LitNot(pLits[1]);
            pLits[2] = Abc_LitNot(pLits[2]);
            fCompl ^= 1;
        }
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else if ( Type == DAU_DSD_PRIME )
    {
        for ( k = 0; k < nLits; k++ )
            pChildren[nChildren++] = Dss_Lit2Obj(p->vObjs, pLits[k]);
    }
    else assert( 0 );

    // shift subgraphs
    Vec_IntClear( p->vLeaves );
    for ( i = 0; i < nChildren; i++ )
        Vec_IntPush( p->vLeaves, Dss_Obj2Lit(pChildren[i]) );
    // create new graph
    pObj = Dss_ObjFindOrAdd( p, Type, p->vLeaves, pTruth );
    return Abc_Var2Lit( pObj->Id, fCompl );
}